

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O0

object __thiscall
pybind11::detail::
object_api<pybind11::detail::accessor<pybind11::detail::accessor_policies::generic_item>>::
operator()(object_api<pybind11::detail::accessor<pybind11::detail::accessor_policies::generic_item>>
           *this,shared_ptr<Person> *args)

{
  accessor<pybind11::detail::accessor_policies::generic_item> *this_00;
  shared_ptr<Person> *in_RDX;
  PyObject local_28;
  shared_ptr<Person> *args_local;
  object_api<pybind11::detail::accessor<pybind11::detail::accessor_policies::generic_item>_>
  *this_local;
  
  args_local = args;
  this_local = (object_api<pybind11::detail::accessor<pybind11::detail::accessor_policies::generic_item>_>
                *)this;
  collect_arguments<(pybind11::return_value_policy)1,std::shared_ptr<Person>&,void>
            ((detail *)&local_28,in_RDX);
  this_00 = object_api<pybind11::detail::accessor<pybind11::detail::accessor_policies::generic_item>_>
            ::derived((object_api<pybind11::detail::accessor<pybind11::detail::accessor_policies::generic_item>_>
                       *)args);
  accessor<pybind11::detail::accessor_policies::generic_item>::ptr(this_00);
  simple_collector<(pybind11::return_value_policy)1>::call
            ((simple_collector<(pybind11::return_value_policy)1> *)this,&local_28);
  simple_collector<(pybind11::return_value_policy)1>::~simple_collector
            ((simple_collector<(pybind11::return_value_policy)1> *)&local_28);
  return (object)(handle)this;
}

Assistant:

object object_api<Derived>::operator()(Args &&...args) const {
    return detail::collect_arguments<policy>(std::forward<Args>(args)...).call(derived().ptr());
}